

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

Matrix<double> * __thiscall
nnad::Matrix<double>::Adjoint(Matrix<double> *__return_storage_ptr__,Matrix<double> *this)

{
  int iVar1;
  int iVar2;
  Matrix<double> Cofactor;
  int local_60;
  int local_5c;
  double local_58;
  Matrix<double> local_50;
  
  if (this->_Lines != this->_Columns) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Adjoint: matrix must be square.",(allocator<char> *)&local_58);
    Error((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_50._Lines = -1;
  Matrix(__return_storage_ptr__,&this->_Lines,&this->_Columns,&local_50._Lines);
  iVar2 = this->_Lines;
  if (iVar2 == 1) {
    local_58 = (double)((ulong)local_58 & 0xffffffff00000000);
    local_60 = 0;
    local_50._Lines = 0;
    local_50._Columns = 0x3ff00000;
    SetElement(__return_storage_ptr__,(int *)&local_58,&local_60,(double *)&local_50);
  }
  else {
    for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
      for (local_5c = 0; local_5c < this->_Columns; local_5c = local_5c + 1) {
        GetCofactor(&local_50,this,local_60,local_5c);
        iVar1 = local_5c;
        iVar2 = local_60;
        local_58 = Determinant(&local_50);
        local_58 = local_58 * (double)(int)(-(iVar1 + iVar2 & 1U) | 1);
        SetElement(__return_storage_ptr__,&local_5c,&local_60,&local_58);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&local_50._Matrix.super__Vector_base<double,_std::allocator<double>_>);
      }
      iVar2 = this->_Lines;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> Adjoint()
    {
      if (_Lines != _Columns)
        Error("Adjoint: matrix must be square.");

      Matrix<T> output{_Lines, _Columns};

      if (_Lines == 1)
        {
          output.SetElement(0,0, T{1});
          return output;
        }
      int sign = 1;

      for (int i = 0; i < _Lines; i++)
        for (int j = 0; j < _Columns; j++)
          {
            // Get cofactor
            Matrix<T> Cofactor = this->GetCofactor(i, j);

            // sign of adj[j][i] positive if sum of row
            // and column indexes is even.
            sign = ((i + j) % 2 == 0) ? 1 : -1;

            // Interchanging rows and columns to get the
            // transpose of the cofactor matrix
            output.SetElement(j, i, (sign) * Cofactor.Determinant());
          }
      return output;
    }